

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer *
SerializePointer<player_t>
          (FSerializer *arc,char *key,player_t **value,player_t **defval,player_t *base)

{
  uint uVar1;
  char cVar2;
  player_t *ppVar3;
  int64_t vv;
  long local_30;
  
  if (base == (player_t *)0x0) {
    __assert_fail("base != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x59f,
                  "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = player_t]"
                 );
  }
  if (arc->r == (FReader *)0x0) {
    uVar1 = (arc->w->mInObject).Count;
    if (uVar1 == 0) {
      cVar2 = '\0';
    }
    else {
      cVar2 = (arc->w->mInObject).Array[uVar1 - 1];
    }
    if (((defval != (player_t **)0x0) && (cVar2 != '\0')) && (*value == *defval)) {
      return arc;
    }
  }
  if (*value == (player_t *)0x0) {
    local_30 = -1;
  }
  else {
    local_30 = ((long)*value - (long)base >> 5) * -0x30c30c30c30c30c3;
  }
  Serialize(arc,key,&local_30,(int64_t *)0x0);
  ppVar3 = base + local_30;
  if (local_30 < 0) {
    ppVar3 = (player_t *)0x0;
  }
  *value = ppVar3;
  return arc;
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}